

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestVerifyInt32::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar2;
  int line;
  Arena *arena;
  TestVerifyInt32 *_this;
  TestVerifyInt32 *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestVerifyInt32 *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestVerifyInt32_const*,edition_unittest::TestVerifyInt32*>
                          ((TestVerifyInt32 **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0xbcbf;
LAB_009d3fe9:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes>::MergeFrom
            (&(local_30->field_0)._impl_.repeated_all_types_,
             (RepeatedPtrField<edition_unittest::TestAllTypes> *)&from_msg[1]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[3]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_all_types_ != nullptr";
        line = 0xbcc8;
        goto LAB_009d3fe9;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar2 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllTypes>
                           (arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x20) = pvVar2;
      }
      else {
        edition_unittest::TestAllTypes::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(int *)((long)&local_30->field_0 + 0x28) = (int)from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 4) != 0) {
      (local_30->field_0)._impl_.optional_int32_2_ =
           *(int32_t *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 8) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar1 & 0x10) != 0) {
      (local_30->field_0)._impl_.optional_int32_64_ =
           *(int32_t *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestVerifyInt32::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestVerifyInt32*>(&to_msg);
  auto& from = static_cast<const TestVerifyInt32&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestVerifyInt32)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_all_types()->MergeFrom(
      from._internal_repeated_all_types());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.optional_all_types_ != nullptr);
      if (_this->_impl_.optional_all_types_ == nullptr) {
        _this->_impl_.optional_all_types_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_all_types_);
      } else {
        _this->_impl_.optional_all_types_->MergeFrom(*from._impl_.optional_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_int32_1_ = from._impl_.optional_int32_1_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.optional_int32_2_ = from._impl_.optional_int32_2_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.optional_int32_63_ = from._impl_.optional_int32_63_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_int32_64_ = from._impl_.optional_int32_64_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}